

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O3

bool libwebm::vttdemux::WriteFiles(metadata_map_t *m,Segment *s)

{
  bool bVar1;
  bool bVar2;
  Cluster *this;
  
  InitializeFiles(m);
  bVar1 = WriteChaptersFile(m,s);
  if (bVar1) {
    this = mkvparser::Segment::GetFirst(s);
    bVar1 = true;
    while ((this != (Cluster *)0x0 && (bVar2 = mkvparser::Cluster::EOS(this), !bVar2))) {
      bVar2 = ProcessCluster(m,this);
      if (!bVar2) goto LAB_0010d90b;
      this = mkvparser::Segment::GetNext(s,this);
    }
  }
  else {
LAB_0010d90b:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool vttdemux::WriteFiles(const metadata_map_t& m, mkvparser::Segment* s) {
  // First write the WebVTT header.

  InitializeFiles(m);

  if (!WriteChaptersFile(m, s))
    return false;

  // Now iterate over the clusters, writing the WebVTT cue as we parse
  // each metadata block.

  const mkvparser::Cluster* cluster = s->GetFirst();

  while (cluster != NULL && !cluster->EOS()) {
    if (!ProcessCluster(m, cluster))
      return false;

    cluster = s->GetNext(cluster);
  }

  return true;
}